

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O2

int socketio_send(CONCRETE_IO_HANDLE socket_io,void *buffer,size_t size,
                 ON_SEND_COMPLETE on_send_complete,void *callback_context)

{
  uint __errnum;
  int iVar1;
  LOGGER_LOG p_Var2;
  LIST_ITEM_HANDLE pLVar3;
  size_t sVar4;
  uint *puVar5;
  int iVar6;
  char *pcVar7;
  
  if ((buffer == (void *)0x0 || socket_io == (CONCRETE_IO_HANDLE)0x0) || size == 0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x3ba;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x3ba;
    }
    pcVar7 = "Invalid argument: send given invalid parameter";
    iVar6 = 0x3b9;
  }
  else if (*(int *)((long)socket_io + 0x50) == 2) {
    pLVar3 = singlylinkedlist_get_head_item(*(SINGLYLINKEDLIST_HANDLE *)((long)socket_io + 0x58));
    if (pLVar3 == (LIST_ITEM_HANDLE)0x0) {
      signal(0xd,(__sighandler_t)0x1);
      sVar4 = send(*socket_io,buffer,size,0x4000);
      if (sVar4 == size) {
        if (on_send_complete == (ON_SEND_COMPLETE)0x0) {
          return 0;
        }
        (*on_send_complete)(callback_context,IO_SEND_OK);
        return 0;
      }
      if (sVar4 == 0xffffffffffffffff) {
        puVar5 = (uint *)__errno_location();
        if ((*puVar5 != 0xb) && (*puVar5 != 0x69)) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return 0x3dd;
          }
          __errnum = *puVar5;
          pcVar7 = strerror(__errnum);
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
                    ,"socketio_send",0x3dc,1,"Failure: sending socket failed. errno=%d (%s).",
                    (ulong)__errnum,pcVar7);
          return 0x3dd;
        }
      }
      if ((long)sVar4 < 1) {
        sVar4 = 0;
      }
      iVar1 = add_pending_io((SOCKET_IO_INSTANCE *)socket_io,(uchar *)((long)buffer + sVar4),
                             size - sVar4,on_send_complete,callback_context);
      if (iVar1 == 0) {
        return 0;
      }
      p_Var2 = xlogging_get_log_function();
      iVar1 = 1000;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 1000;
      }
      pcVar7 = "Failure: add_pending_io failed.";
      iVar6 = 999;
    }
    else {
      iVar1 = add_pending_io((SOCKET_IO_INSTANCE *)socket_io,(uchar *)buffer,size,on_send_complete,
                             callback_context);
      if (iVar1 == 0) {
        return 0;
      }
      p_Var2 = xlogging_get_log_function();
      iVar1 = 0x3cc;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x3cc;
      }
      pcVar7 = "Failure: add_pending_io failed.";
      iVar6 = 0x3cb;
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x3c2;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x3c2;
    }
    pcVar7 = "Failure: socket state is not opened.";
    iVar6 = 0x3c1;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
            ,"socketio_send",iVar6,1,pcVar7);
  return iVar1;
}

Assistant:

int socketio_send(CONCRETE_IO_HANDLE socket_io, const void* buffer, size_t size, ON_SEND_COMPLETE on_send_complete, void* callback_context)
{
    int result;

    if ((socket_io == NULL) ||
        (buffer == NULL) ||
        (size == 0))
    {
        /* Invalid arguments */
        LogError("Invalid argument: send given invalid parameter");
        result = MU_FAILURE;
    }
    else
    {
        SOCKET_IO_INSTANCE* socket_io_instance = (SOCKET_IO_INSTANCE*)socket_io;
        if (socket_io_instance->io_state != IO_STATE_OPEN)
        {
            LogError("Failure: socket state is not opened.");
            result = MU_FAILURE;
        }
        else
        {
            LIST_ITEM_HANDLE first_pending_io = singlylinkedlist_get_head_item(socket_io_instance->pending_io_list);
            if (first_pending_io != NULL)
            {
                if (add_pending_io(socket_io_instance, buffer, size, on_send_complete, callback_context) != 0)
                {
                    LogError("Failure: add_pending_io failed.");
                    result = MU_FAILURE;
                }
                else
                {
                    result = 0;
                }
            }
            else
            {
                signal(SIGPIPE, SIG_IGN);

                ssize_t send_result = send(socket_io_instance->socket, buffer, size, MSG_NOSIGNAL);
                if ((size_t)send_result != size)
                {
                    if (send_result == SOCKET_SEND_FAILURE && errno != EAGAIN && errno != ENOBUFS)
                    {
                        LogError("Failure: sending socket failed. errno=%d (%s).", errno, strerror(errno));
                        result = MU_FAILURE;
                    }
                    else
                    {
                        /*send says "come back later" with EAGAIN, ENOBUFS - likely the socket buffer cannot accept more data*/
                        /* queue data */
                        size_t bytes_sent = (send_result < 0 ? 0 : send_result);

                        if (add_pending_io(socket_io_instance, (const unsigned char*)buffer + bytes_sent, size - bytes_sent, on_send_complete, callback_context) != 0)
                        {
                            LogError("Failure: add_pending_io failed.");
                            result = MU_FAILURE;
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
                else
                {
                    if (on_send_complete != NULL)
                    {
                        on_send_complete(callback_context, IO_SEND_OK);
                    }

                    result = 0;
                }
            }
        }
    }

    return result;
}